

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O2

ze_result_t
tracing_layer::zeImageViewCreateExp
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t hImage,ze_image_handle_t *phImageView)

{
  ulong uVar1;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr__ze_image_desc_t_ptr__ze_image_handle_t_ptr__ze_image_handle_t_ptr_ptr
  *zeApiPtr;
  _ze_result_t _Var2;
  ze_result_t zVar3;
  char *pcVar4;
  undefined1 *puVar5;
  ulong *puVar6;
  _func_void__ze_image_view_create_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var7;
  long lVar8;
  size_t i;
  ulong uVar9;
  ze_image_handle_t *phImageView_local;
  ze_image_handle_t hImage_local;
  ze_image_desc_t *desc_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  APITracerCallbackDataImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_88;
  _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_70;
  ze_image_view_create_exp_params_t tracerParams;
  
  if (DAT_001894f8 ==
      (_func__ze_result_t__ze_context_handle_t_ptr__ze_device_handle_t_ptr__ze_image_desc_t_ptr__ze_image_handle_t_ptr__ze_image_handle_t_ptr_ptr
       *)0x0) {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    phImageView_local = phImageView;
    hImage_local = hImage;
    desc_local = desc;
    hDevice_local = hDevice;
    hContext_local = hContext;
    pcVar4 = (char *)tracingInProgress();
    if (*pcVar4 != '\0') {
      _Var2 = (*DAT_001894f8)(hContext,hDevice,desc,hImage,phImageView);
      return _Var2;
    }
    puVar5 = (undefined1 *)tracingInProgress();
    *puVar5 = 1;
    tracerParams.phContext = &hContext_local;
    tracerParams.phDevice = &hDevice_local;
    tracerParams.pdesc = &desc_local;
    tracerParams.phImage = &hImage_local;
    tracerParams.pphImageView = &phImageView_local;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.apiOrdinal =
         (_func_void__ze_image_view_create_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *)0x0
    ;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if (puVar6 == (ulong *)0x0) {
      p_Var7 = (_func_void__ze_image_view_create_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                *)0x0;
    }
    else {
      lVar8 = 0xcb0;
      for (uVar9 = 0; p_Var7 = apiCallbackData.apiOrdinal, uVar9 < *puVar6; uVar9 = uVar9 + 1) {
        uVar1 = puVar6[1];
        prologCallback.current_api_callback =
             *(_func_void__ze_image_view_create_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0x858) + lVar8);
        p_Var7 = *(_func_void__ze_image_view_create_exp_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x200) + lVar8);
        prologCallback.pUserData = *(void **)(uVar1 + lVar8);
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.prologCallbacks,&prologCallback);
        epilogCallback.pUserData = *(void **)(puVar6[1] + lVar8);
        epilogCallback.current_api_callback = p_Var7;
        std::
        vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ::push_back(&apiCallbackData.epilogCallbacks,&epilogCallback);
        lVar8 = lVar8 + 0xcb8;
      }
    }
    zeApiPtr = DAT_001894f8;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_70,&apiCallbackData.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
              *)&local_88,&apiCallbackData.epilogCallbacks);
    zVar3 = APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_device_handle_t*,_ze_image_desc_t_const*,_ze_image_handle_t*,_ze_image_handle_t**),_ze_image_view_create_exp_params_t*,void(*)(_ze_image_view_create_exp_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_view_create_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_view_create_exp_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_view_create_exp_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_image_view_create_exp_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_device_handle_t*&,_ze_image_desc_t_const*&,_ze_image_handle_t*&,_ze_image_handle_t**&>
                      (zeApiPtr,&tracerParams,p_Var7,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_70,
                       (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                        *)&local_88,&hContext_local,&hDevice_local,&desc_local,&hImage_local,
                       &phImageView_local);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_88);
    std::
    _Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::~_Vector_base(&local_70);
    APITracerCallbackDataImp<void_(*)(_ze_image_view_create_exp_params_t_*,__ze_result_t,_void_*,_void_**)>
    ::~APITracerCallbackDataImp(&apiCallbackData);
  }
  return zVar3;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageViewCreateExp(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t hImage,                       ///< [in] handle of image object to create view from
        ze_image_handle_t* phImageView                  ///< [out] pointer to handle of image object created for view
        )
    {
        auto pfnViewCreateExp = context.zeDdiTable.ImageExp.pfnViewCreateExp;

        if( nullptr == pfnViewCreateExp)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.ImageExp.pfnViewCreateExp, hContext, hDevice, desc, hImage, phImageView);

        // capture parameters
        ze_image_view_create_exp_params_t tracerParams = {
            &hContext,
            &hDevice,
            &desc,
            &hImage,
            &phImageView
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnImageViewCreateExpCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnImageViewCreateExpCb_t, Image, pfnViewCreateExpCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.ImageExp.pfnViewCreateExp,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phDevice,
                                                  *tracerParams.pdesc,
                                                  *tracerParams.phImage,
                                                  *tracerParams.pphImageView);
    }